

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.c
# Opt level: O0

void nn_fsm_swap_owner(nn_fsm *self,nn_fsm_owner *owner)

{
  int iVar1;
  nn_fsm *pnVar2;
  nn_fsm *oldowner;
  int oldsrc;
  nn_fsm_owner *owner_local;
  nn_fsm *self_local;
  
  iVar1 = self->src;
  pnVar2 = self->owner;
  self->src = owner->src;
  self->owner = owner->fsm;
  owner->src = iVar1;
  owner->fsm = pnVar2;
  return;
}

Assistant:

void nn_fsm_swap_owner (struct nn_fsm *self, struct nn_fsm_owner *owner)
{
    int oldsrc;
    struct nn_fsm *oldowner;

    oldsrc = self->src;
    oldowner = self->owner;
    self->src = owner->src;
    self->owner = owner->fsm;
    owner->src = oldsrc;
    owner->fsm = oldowner;
}